

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::Version::Clear(Version *this)

{
  string *psVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    if ((this->suffix_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                 ,0x121);
      other = internal::LogMessage::operator<<
                        (&local_50,
                         "CHECK failed: !suffix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      internal::LogFinisher::operator=(&local_51,other);
      internal::LogMessage::~LogMessage(&local_50);
    }
    psVar1 = (this->suffix_).ptr_;
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  if (((this->_has_bits_).has_bits_[0] & 0xe) != 0) {
    this->patch_ = 0;
    this->major_ = 0;
    this->minor_ = 0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void Version::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.Version)
  if (has_suffix()) {
    GOOGLE_DCHECK(!suffix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*suffix_.UnsafeRawStringPointer())->clear();
  }
  if (_has_bits_[0 / 32] & 14u) {
    ::memset(&major_, 0, reinterpret_cast<char*>(&patch_) -
      reinterpret_cast<char*>(&major_) + sizeof(patch_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}